

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varmap.cc
# Opt level: O0

void __thiscall ScopeLocal::collectNameRecs(ScopeLocal *this)

{
  bool bVar1;
  int2 iVar2;
  int4 sz;
  reference ppSVar3;
  SymbolEntry *this_00;
  uint8 hash;
  RangeList *pRVar4;
  AddrSpace *id;
  uintb off;
  Address *addr;
  string *psVar5;
  Address local_70;
  Range *local_60;
  Range *range;
  Address usepoint;
  SymbolEntry *entry;
  Symbol *local_28;
  Symbol *sym;
  _Self local_18;
  iterator iter;
  ScopeLocal *this_local;
  
  iter._M_node = (_Base_ptr)this;
  std::
  map<AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<AddressUsePointPair>,_std::allocator<std::pair<const_AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->nameRecommend);
  std::__cxx11::list<DynamicRecommend,_std::allocator<DynamicRecommend>_>::clear
            (&this->dynRecommend);
  local_18._M_node =
       (_Base_ptr)
       std::set<Symbol_*,_SymbolCompareName,_std::allocator<Symbol_*>_>::begin
                 (&(this->super_ScopeInternal).nametree);
  while( true ) {
    sym = (Symbol *)
          std::set<Symbol_*,_SymbolCompareName,_std::allocator<Symbol_*>_>::end
                    (&(this->super_ScopeInternal).nametree);
    bVar1 = std::operator!=(&local_18,(_Self *)&sym);
    if (!bVar1) break;
    entry = (SymbolEntry *)std::_Rb_tree_const_iterator<Symbol_*>::operator++(&local_18,0);
    ppSVar3 = std::_Rb_tree_const_iterator<Symbol_*>::operator*
                        ((_Rb_tree_const_iterator<Symbol_*> *)&entry);
    local_28 = *ppSVar3;
    bVar1 = Symbol::isNameLocked(local_28);
    if (((bVar1) && (bVar1 = Symbol::isTypeLocked(local_28), !bVar1)) &&
       (this_00 = Symbol::getFirstWholeMap(local_28), this_00 != (SymbolEntry *)0x0)) {
      bVar1 = SymbolEntry::isDynamic(this_00);
      if (bVar1) {
        SymbolEntry::getFirstUseAddress((SymbolEntry *)&usepoint.offset);
        hash = SymbolEntry::getHash(this_00);
        psVar5 = Symbol::getName_abi_cxx11_(local_28);
        addDynamicRecommend(this,(Address *)&usepoint.offset,hash,psVar5);
      }
      else {
        Address::Address((Address *)&range);
        pRVar4 = SymbolEntry::getUseLimit(this_00);
        bVar1 = RangeList::empty(pRVar4);
        if (!bVar1) {
          pRVar4 = SymbolEntry::getUseLimit(this_00);
          local_60 = RangeList::getFirstRange(pRVar4);
          id = Range::getSpace(local_60);
          off = Range::getFirst(local_60);
          Address::Address(&local_70,id,off);
          Address::operator=((Address *)&range,&local_70);
        }
        addr = SymbolEntry::getAddr(this_00);
        psVar5 = Symbol::getName_abi_cxx11_(local_28);
        sz = SymbolEntry::getSize(this_00);
        addRecommendName(this,addr,(Address *)&range,psVar5,sz);
      }
      iVar2 = Symbol::getCategory(local_28);
      if (iVar2 < 0) {
        (*(this->super_ScopeInternal).super_Scope._vptr_Scope[0x13])(this,local_28);
      }
    }
  }
  return;
}

Assistant:

void ScopeLocal::collectNameRecs(void)

{
  nameRecommend.clear();	// Clear out any old name recommendations
  dynRecommend.clear();

  SymbolNameTree::iterator iter = nametree.begin();
  while(iter!=nametree.end()) {
    Symbol *sym = *iter++;
    if (sym->isNameLocked()&&(!sym->isTypeLocked())) {
      SymbolEntry *entry = sym->getFirstWholeMap();
      if (entry != (SymbolEntry *)0) {
	if (entry->isDynamic()) {
	  addDynamicRecommend(entry->getFirstUseAddress(), entry->getHash(), sym->getName());
	}
	else {
	  Address usepoint;
	  if (!entry->getUseLimit().empty()) {
	    const Range *range = entry->getUseLimit().getFirstRange();
	    usepoint = Address(range->getSpace(),range->getFirst());
	  }
	  addRecommendName( entry->getAddr(), usepoint, sym->getName(), entry->getSize() );
	}
	if (sym->getCategory()<0)
	  removeSymbol(sym);
      }
    }
  }
}